

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::CNullDriver
          (CNullDriver *this,IFileSystem *io,dimension2d<unsigned_int> *screenSize)

{
  _func_int **pp_Var1;
  void *__s;
  dimension2d<unsigned_int> *in_RDX;
  _func_int **in_RSI;
  IVideoDriver *in_RDI;
  u32 i;
  vector2d<int> *in_stack_ffffffffffffff38;
  IImageLoader **element;
  SOverrideMaterial *in_stack_ffffffffffffff40;
  array<irr::video::IImageLoader_*> *this_00;
  undefined8 in_stack_ffffffffffffff48;
  SMaterial *fn;
  SMaterial *in_stack_ffffffffffffff50;
  SMaterial *this_01;
  uint local_7c;
  dimension2d<int> local_44;
  vector2d<int> local_3c;
  undefined8 local_34;
  undefined8 local_2c;
  SColor local_24;
  uint local_20 [2];
  dimension2d<unsigned_int> *local_18;
  _func_int **local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[0x24].field_0x10);
  IVideoDriver::IVideoDriver(in_RDI,&PTR_construction_vtable_24__0043aeb0);
  IGPUProgrammingServices::IGPUProgrammingServices((IGPUProgrammingServices *)&in_RDI->field_0x8);
  in_RDI->_vptr_IVideoDriver = (_func_int **)0x43aa88;
  *(undefined8 *)&in_RDI[0x24].field_0x10 = 0x43ae98;
  *(undefined8 *)&in_RDI->field_0x8 = 0x43ae50;
  core::array<irr::video::CNullDriver::SSurface>::array
            ((array<irr::video::CNullDriver::SSurface> *)in_stack_ffffffffffffff40);
  core::array<irr::video::CNullDriver::SOccQuery>::array
            ((array<irr::video::CNullDriver::SOccQuery> *)in_stack_ffffffffffffff40);
  core::array<irr::video::IRenderTarget_*>::array
            ((array<irr::video::IRenderTarget_*> *)in_stack_ffffffffffffff40);
  *(undefined8 *)&in_RDI[3].field_0x10 = 0;
  core::array<irr::video::ITexture_*>::array
            ((array<irr::video::ITexture_*> *)in_stack_ffffffffffffff40);
  *(undefined8 *)&in_RDI[4].field_0x18 = 0;
  local_20[1] = 0;
  local_20[0] = 0;
  core::dimension2d<unsigned_int>::dimension2d
            ((dimension2d<unsigned_int> *)(in_RDI + 5),local_20 + 1,local_20);
  core::array<irr::video::IImageLoader_*>::array
            ((array<irr::video::IImageLoader_*> *)in_stack_ffffffffffffff40);
  core::array<irr::video::IImageWriter_*>::array
            ((array<irr::video::IImageWriter_*> *)in_stack_ffffffffffffff40);
  core::array<irr::video::CNullDriver::SMaterialRenderer>::array
            ((array<irr::video::CNullDriver::SMaterialRenderer> *)in_stack_ffffffffffffff40);
  std::__cxx11::
  list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ::list((list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
          *)0x308894);
  in_RDI[9]._vptr_IVideoDriver = local_10;
  *(undefined8 *)&in_RDI[9].field_0x8 = 0;
  core::rect<int>::rect
            ((rect<int> *)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (int)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
             (int)in_stack_ffffffffffffff40);
  *(dimension2d<unsigned_int> *)(in_RDI + 10) = *local_18;
  core::CMatrix4<float>::CMatrix4
            ((CMatrix4<float> *)in_stack_ffffffffffffff40,
             (eConstructor)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  CFPSCounter::CFPSCounter((CFPSCounter *)&in_RDI[0xc].field_0x8);
  *(undefined4 *)((long)&in_RDI[0xd]._vptr_IVideoDriver + 4) = 0;
  *(undefined4 *)&in_RDI[0xd].field_0x8 = 500;
  *(undefined4 *)&in_RDI[0xd].field_0xc = 0;
  SColor::SColor((SColor *)&in_RDI[0xd].field_0x1c);
  SExposedVideoData::SExposedVideoData((SExposedVideoData *)(in_RDI + 0xe));
  SOverrideMaterial::SOverrideMaterial(in_stack_ffffffffffffff40);
  SMaterial::SMaterial(in_stack_ffffffffffffff50);
  SMaterial::SMaterial(in_stack_ffffffffffffff50);
  in_RDI[0x22].field_0x8 = 0;
  in_RDI[0x22].field_0x12 = 0;
  SColorf::SColorf((SColorf *)&in_RDI[0x23].field_0x1c);
  pp_Var1 = (_func_int **)operator_new(0x48);
  irr::io::CAttributes::CAttributes
            ((CAttributes *)in_stack_ffffffffffffff40,(IVideoDriver *)in_stack_ffffffffffffff38);
  in_RDI[0xf]._vptr_IVideoDriver = pp_Var1;
  (**(code **)(*in_RDI[0xf]._vptr_IVideoDriver + 0x38))
            (in_RDI[0xf]._vptr_IVideoDriver,"MaxTextures",4);
  (**(code **)(*in_RDI[0xf]._vptr_IVideoDriver + 0x38))
            (in_RDI[0xf]._vptr_IVideoDriver,"MaxSupportedTextures",4);
  (**(code **)(*in_RDI[0xf]._vptr_IVideoDriver + 0x38))
            (in_RDI[0xf]._vptr_IVideoDriver,"MaxAnisotropy",1);
  (**(code **)(*in_RDI[0xf]._vptr_IVideoDriver + 0x38))
            (in_RDI[0xf]._vptr_IVideoDriver,"MaxMultipleRenderTargets",1);
  (**(code **)(*in_RDI[0xf]._vptr_IVideoDriver + 0x38))
            (in_RDI[0xf]._vptr_IVideoDriver,"MaxIndices",0xffffffff);
  (**(code **)(*in_RDI[0xf]._vptr_IVideoDriver + 0x38))
            (in_RDI[0xf]._vptr_IVideoDriver,"MaxTextureSize",0xffffffff);
  (**(code **)(*in_RDI[0xf]._vptr_IVideoDriver + 0x38))(in_RDI[0xf]._vptr_IVideoDriver,"Version",1);
  SColor::SColor(&local_24,0,0xff,0xff,0xff);
  (*in_RDI->_vptr_IVideoDriver[0x38])
            (0x42480000,0x42c80000,0x3c23d70a,in_RDI,(ulong)local_24.color,1,0);
  (*in_RDI->_vptr_IVideoDriver[0x43])(in_RDI,2,1);
  (*in_RDI->_vptr_IVideoDriver[0x43])(in_RDI,0x10,1);
  (*in_RDI->_vptr_IVideoDriver[0x43])(in_RDI,0x100,1);
  (*in_RDI->_vptr_IVideoDriver[0x43])(in_RDI,0x80,1);
  core::vector2d<int>::vector2d(&local_3c,0,0);
  core::dimension2d<int>::dimension2d<unsigned_int>(&local_44,local_18);
  core::rect<int>::rect<int>
            ((rect<int> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (dimension2d<int> *)0x308b85);
  *(undefined8 *)&in_RDI[9].field_0x10 = local_34;
  *(undefined8 *)&in_RDI[9].field_0x18 = local_2c;
  __s = operator_new(0x20);
  memset(__s,0,0x20);
  irr::scene::CMeshManipulator::CMeshManipulator((CMeshManipulator *)in_stack_ffffffffffffff40);
  *(void **)&in_RDI[9].field_0x8 = __s;
  if (in_RDI[9]._vptr_IVideoDriver != (_func_int **)0x0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)in_RDI[9]._vptr_IVideoDriver +
               *(long *)(*in_RDI[9]._vptr_IVideoDriver + -0x18)));
  }
  element = (IImageLoader **)&in_RDI[5].field_0x8;
  createImageLoaderTGA();
  core::array<irr::video::IImageLoader_*>::push_back
            ((array<irr::video::IImageLoader_*> *)in_stack_ffffffffffffff40,element);
  this_00 = (array<irr::video::IImageLoader_*> *)&in_RDI[5].field_0x8;
  createImageLoaderPNG();
  core::array<irr::video::IImageLoader_*>::push_back(this_00,element);
  fn = (SMaterial *)&in_RDI[5].field_0x8;
  createImageLoaderJPG();
  core::array<irr::video::IImageLoader_*>::push_back(this_00,element);
  this_01 = (SMaterial *)&in_RDI[5].field_0x8;
  createImageLoaderBMP();
  core::array<irr::video::IImageLoader_*>::push_back(this_00,element);
  createImageWriterJPG();
  core::array<irr::video::IImageWriter_*>::push_back
            ((array<irr::video::IImageWriter_*> *)this_00,(IImageWriter **)element);
  createImageWriterPNG();
  core::array<irr::video::IImageWriter_*>::push_back
            ((array<irr::video::IImageWriter_*> *)this_00,(IImageWriter **)element);
  memset(in_RDI + 0xe,0,0x20);
  for (local_7c = 0; local_7c < 0x27; local_7c = local_7c + 1) {
    (&in_RDI[0x22].field_0x13)[local_7c] = 1;
  }
  in_RDI[0x21].field_0x11 = 0;
  *(ushort *)&in_RDI[0x22]._vptr_IVideoDriver = *(ushort *)&in_RDI[0x22]._vptr_IVideoDriver & 0xfff7
  ;
  *(ushort *)&in_RDI[0x22]._vptr_IVideoDriver = *(ushort *)&in_RDI[0x22]._vptr_IVideoDriver & 0xffcf
  ;
  in_RDI[0x21].field_0x10 = 0;
  *(ushort *)&in_RDI[0x22]._vptr_IVideoDriver = *(ushort *)&in_RDI[0x22]._vptr_IVideoDriver & 0xfbff
  ;
  SMaterial::
  forEachTexture<irr::video::CNullDriver::CNullDriver(irr::io::IFileSystem*,irr::core::dimension2d<unsigned_int>const&)::__0>
            (this_01,(anon_class_1_0_00000001 *)fn);
  SMaterial::operator=(this_01,fn);
  return;
}

Assistant:

CNullDriver::CNullDriver(io::IFileSystem *io, const core::dimension2d<u32> &screenSize) :
		SharedRenderTarget(0), CurrentRenderTarget(0), CurrentRenderTargetSize(0, 0), FileSystem(io), MeshManipulator(0),
		ViewPort(0, 0, 0, 0), ScreenSize(screenSize), PrimitivesDrawn(0), MinVertexCountForVBO(500),
		TextureCreationFlags(0), OverrideMaterial2DEnabled(false), AllowZWriteOnTransparent(false)
{
#ifdef _DEBUG
	setDebugName("CNullDriver");
#endif

	DriverAttributes = new io::CAttributes();
	DriverAttributes->addInt("MaxTextures", MATERIAL_MAX_TEXTURES);
	DriverAttributes->addInt("MaxSupportedTextures", MATERIAL_MAX_TEXTURES);
	DriverAttributes->addInt("MaxAnisotropy", 1);
	//	DriverAttributes->addInt("MaxUserClipPlanes", 0);
	//	DriverAttributes->addInt("MaxAuxBuffers", 0);
	DriverAttributes->addInt("MaxMultipleRenderTargets", 1);
	DriverAttributes->addInt("MaxIndices", -1);
	DriverAttributes->addInt("MaxTextureSize", -1);
	//	DriverAttributes->addInt("MaxGeometryVerticesOut", 0);
	//	DriverAttributes->addFloat("MaxTextureLODBias", 0.f);
	DriverAttributes->addInt("Version", 1);
	//	DriverAttributes->addInt("ShaderLanguageVersion", 0);
	//	DriverAttributes->addInt("AntiAlias", 0);

	setFog();

	setTextureCreationFlag(ETCF_ALWAYS_32_BIT, true);
	setTextureCreationFlag(ETCF_CREATE_MIP_MAPS, true);
	setTextureCreationFlag(ETCF_AUTO_GENERATE_MIP_MAPS, true);
	setTextureCreationFlag(ETCF_ALLOW_MEMORY_COPY, true);

	ViewPort = core::rect<s32>(core::position2d<s32>(0, 0), core::dimension2di(screenSize));

	// create manipulator
	MeshManipulator = new scene::CMeshManipulator();

	if (FileSystem)
		FileSystem->grab();

	// create surface loaders and writers
	SurfaceLoader.push_back(video::createImageLoaderTGA());
	SurfaceLoader.push_back(video::createImageLoaderPNG());
	SurfaceLoader.push_back(video::createImageLoaderJPG());
	SurfaceLoader.push_back(video::createImageLoaderBMP());

	SurfaceWriter.push_back(video::createImageWriterJPG());
	SurfaceWriter.push_back(video::createImageWriterPNG());

	// set ExposedData to 0
	memset((void *)&ExposedData, 0, sizeof(ExposedData));
	for (u32 i = 0; i < video::EVDF_COUNT; ++i)
		FeatureEnabled[i] = true;

	InitMaterial2D.AntiAliasing = video::EAAM_OFF;
	InitMaterial2D.Lighting = false;
	InitMaterial2D.ZWriteEnable = video::EZW_OFF;
	InitMaterial2D.ZBuffer = video::ECFN_DISABLED;
	InitMaterial2D.UseMipMaps = false;
	InitMaterial2D.forEachTexture([](auto &tex) {
		// Using ETMINF_LINEAR_MIPMAP_NEAREST (bilinear) for 2D graphics looks
		// much better and doesn't have any downsides (e.g. regarding pixel art).
		tex.MinFilter = video::ETMINF_LINEAR_MIPMAP_NEAREST;
		tex.MagFilter = video::ETMAGF_NEAREST;
		tex.TextureWrapU = video::ETC_REPEAT;
		tex.TextureWrapV = video::ETC_REPEAT;
		tex.TextureWrapW = video::ETC_REPEAT;
	});
	OverrideMaterial2D = InitMaterial2D;
}